

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::NameEntry::getdata(NameEntry *this,uint8_t *p,ImgfsFile *param_2)

{
  iterator __first;
  iterator __last;
  undefined1 local_40 [8];
  Wstring wstr;
  ImgfsFile *param_2_local;
  uint8_t *p_local;
  NameEntry *this_local;
  
  wstr.field_2._8_8_ = param_2;
  set32le<unsigned_char*>(p,(this->super_DirEntry)._magic);
  ToWString<char>((Wstring *)local_40,&this->_name);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize((Wstring *)local_40,0x18);
  __first = std::__cxx11::
            basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
            ::begin((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)local_40);
  __last = std::__cxx11::
           basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
           ::end((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)local_40);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_short*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>,unsigned_short*>
            ((__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
              )__last._M_current,(unsigned_short *)(p + 4));
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  ~basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                 *)local_40);
  return;
}

Assistant:

virtual void getdata(uint8_t* p, ImgfsFile& /*imgfs*/)
        {
            set32le(p, _magic);
            std::Wstring wstr= ToWString(_name);
            wstr.resize(24);
            // note: nonportable endian cast
            std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
        }